

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ast.cpp
# Opt level: O2

void __thiscall PrintAST::visit(PrintAST *this,CallNode *node)

{
  TokenNode *pTVar1;
  ExpListNode *pEVar2;
  
  printAST(this,"CALL");
  this->level = this->level + 1;
  pTVar1 = node->id;
  if (pTVar1 != (TokenNode *)0x0) {
    (*(pTVar1->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar1,this);
  }
  pEVar2 = node->parameters;
  if (pEVar2 != (ExpListNode *)0x0) {
    (*(pEVar2->super_ASTNode)._vptr_ASTNode[3])(pEVar2,this);
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void PrintAST::visit(CallNode *node) {
    this->printAST("CALL");
    up_level();
    if (node->getId() != nullptr) {
        node->getId()->accept(this);
    }
    if (node->getParameters() != nullptr) {
        node->getParameters()->accept(this);
    }
    down_level();
}